

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

double __thiscall smf::Options::getDouble(Options *this,string *optionName)

{
  double dVar1;
  string local_28;
  
  getString(&local_28,this,optionName);
  dVar1 = strtod(local_28._M_dataplus._M_p,(char **)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return dVar1;
}

Assistant:

double Options::getDouble(const std::string& optionName) {
   return strtod(getString(optionName).c_str(), (char**)NULL);
}